

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompilationcontext.cpp
# Opt level: O1

void __thiscall
SQCompilation::SQCompilationContext::vreportDiagnostic
          (SQCompilationContext *this,DiagnosticsId diagId,int32_t line,int32_t pos,int32_t width,
          __va_list_tag *vargs)

{
  SQUnsignedInteger *pSVar1;
  long lVar2;
  SQObjectType SVar3;
  SQSharedState *pSVar4;
  SQCOMPILERERROR p_Var5;
  SQ_COMPILER_DIAG_CB p_Var6;
  SQVM *pSVar7;
  SQTable *pSVar8;
  _Alloc_hider s;
  bool bVar9;
  bool bVar10;
  byte *pbVar11;
  SQString *pSVar12;
  SQMessageSeverity SVar13;
  byte *pbVar14;
  int32_t iVar15;
  int iVar16;
  SQChar *pSVar17;
  string extraInfo;
  string message;
  SQCompilerMessage cm;
  SQChar *local_c8;
  undefined8 local_c0;
  SQChar local_b8;
  undefined7 uStack_b7;
  byte *local_a8;
  byte *local_a0;
  int local_94;
  string local_90;
  long local_70;
  SQCompilerMessage local_68;
  
  bVar9 = isDisabled(this,diagId,line,pos);
  if (!bVar9) {
    local_70 = (ulong)diagId * 5;
    local_94 = *(int *)(diagnosticDescriptors + (ulong)diagId * 0x28 + 8);
    bVar9 = 1 < local_94;
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    local_90._M_string_length = 0;
    local_90.field_2._M_local_buf[0] = '\0';
    vrenderDiagnosticHeader(diagId,&local_90,vargs);
    local_c8 = &local_b8;
    local_c0 = 0;
    local_b8 = '\0';
    local_a0 = (byte *)findLine(this,line + -1);
    pbVar11 = (byte *)findLine(this,line);
    local_a8 = (byte *)findLine(this,line + 1);
    bVar10 = isBlankLine((char *)local_a0);
    if (!bVar10) {
      std::__cxx11::string::push_back((char)&local_c8);
      pbVar14 = local_a0;
      while ((0xd < *pbVar14 || ((0x2401U >> (*pbVar14 & 0x1f) & 1) == 0))) {
        pbVar14 = pbVar14 + 1;
        std::__cxx11::string::push_back((char)&local_c8);
      }
    }
    if (pbVar11 != (byte *)0x0) {
      std::__cxx11::string::push_back((char)&local_c8);
      pbVar14 = pbVar11;
      while ((0xd < *pbVar14 || ((0x2401U >> (*pbVar14 & 0x1f) & 1) == 0))) {
        pbVar14 = pbVar14 + 1;
        std::__cxx11::string::push_back((char)&local_c8);
      }
      std::__cxx11::string::push_back((char)&local_c8);
      if (pos < 1) {
        iVar16 = 1;
      }
      else {
        iVar15 = pos;
        do {
          std::__cxx11::string::push_back((char)&local_c8);
          iVar15 = iVar15 + -1;
        } while (iVar15 != 0);
        iVar16 = pos + 1;
      }
      std::__cxx11::string::push_back((char)&local_c8);
      iVar16 = iVar16 - pos;
      if (iVar16 < width) {
        do {
          std::__cxx11::string::push_back((char)&local_c8);
          iVar16 = iVar16 + 1;
        } while (iVar16 < width);
      }
    }
    bVar10 = isBlankLine((char *)local_a8);
    if (!bVar10) {
      std::__cxx11::string::push_back((char)&local_c8);
      pbVar14 = local_a8;
      while ((0xd < *pbVar14 || ((0x2401U >> (*pbVar14 & 0x1f) & 1) == 0))) {
        pbVar14 = pbVar14 + 1;
        std::__cxx11::string::push_back((char)&local_c8);
      }
    }
    if (((pbVar11 == (byte *)0x0) && (local_a0 == (byte *)0x0)) && (local_a8 == (byte *)0x0)) {
      pSVar17 = (SQChar *)0x0;
    }
    else {
      std::__cxx11::string::push_back((char)&local_c8);
      std::__cxx11::string::push_back((char)&local_c8);
      pSVar17 = local_c8;
    }
    s._M_p = local_90._M_dataplus._M_p;
    lVar2 = local_70 * 8;
    pSVar4 = this->_vm->_sharedstate;
    p_Var5 = pSVar4->_compilererrorhandler;
    p_Var6 = pSVar4->_compilerdiaghandler;
    if (p_Var6 != (SQ_COMPILER_DIAG_CB)0x0) {
      local_68.intId = *(int *)(diagnosticDescriptors + lVar2 + 0x10);
      local_68.textId = *(char **)(diagnosticDescriptors + lVar2 + 0x18);
      local_68.message = local_90._M_dataplus._M_p;
      local_68.fileName = this->_sourceName;
      local_68.line = line;
      local_68.column = pos;
      local_68.columnsWidth = width;
      local_68.isError = bVar9;
      (*p_Var6)(this->_vm,&local_68);
    }
    if ((this->_raiseError == true) && (p_Var5 != (SQCOMPILERERROR)0x0)) {
      SVar13 = (*(int *)(diagnosticDescriptors + lVar2 + 8) != 1) + SEV_WARNING;
      if (*(int *)(diagnosticDescriptors + lVar2 + 8) == 0) {
        SVar13 = SEV_HINT;
      }
      (*p_Var5)(this->_vm,SVar13,s._M_p,this->_sourceName,(long)line,(long)pos,pSVar17);
    }
    if (1 < local_94) {
      pSVar12 = SQString::Create(this->_vm->_sharedstate,s._M_p,local_90._M_string_length);
      pSVar7 = this->_vm;
      pSVar8 = (pSVar7->_lasterror).super_SQObject._unVal.pTable;
      SVar3 = (pSVar7->_lasterror).super_SQObject._type;
      (pSVar7->_lasterror).super_SQObject._type = OT_STRING;
      (pSVar7->_lasterror).super_SQObject._flags = '\0';
      (pSVar7->_lasterror).super_SQObject._unVal.pString = pSVar12;
      pSVar1 = &(pSVar12->super_SQRefCounted)._uiRef;
      *pSVar1 = *pSVar1 + 1;
      if ((SVar3 >> 0x1b & 1) != 0) {
        pSVar1 = &(pSVar8->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 - 1;
        if (*pSVar1 == 0) {
          (*(pSVar8->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2]
          )();
        }
      }
      if (local_c8 != &local_b8) {
        operator_delete(local_c8,CONCAT71(uStack_b7,local_b8) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,
                        CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                                 local_90.field_2._M_local_buf[0]) + 1);
      }
      longjmp((__jmp_buf_tag *)this->_errorjmp,1);
    }
    if (local_c8 != &local_b8) {
      operator_delete(local_c8,CONCAT71(uStack_b7,local_b8) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,
                      CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                               local_90.field_2._M_local_buf[0]) + 1);
    }
  }
  return;
}

Assistant:

void SQCompilationContext::vreportDiagnostic(enum DiagnosticsId diagId, int32_t line, int32_t pos, int32_t width, va_list vargs) {
  assert(diagId < DI_NUM_OF_DIAGNOSTICS);

  bool doJump = false;

  if (!isDisabled(diagId, line, pos)) {

    auto &desc = diagnosticDescriptors[diagId];
    bool isError = desc.severity >= DS_ERROR;
    std::string message;

    vrenderDiagnosticHeader(diagId, message, vargs);

    std::string extraInfo;

    const char *l1 = findLine(line - 1);
    const char *l2 = findLine(line);
    const char *l3 = findLine(line + 1);

    if (!isBlankLine(l1)) {
      extraInfo.push_back('\n');
      int32_t j = 0;
      while (l1[j] && l1[j] != '\n' && l1[j] != '\r') { //-V522
        extraInfo.push_back(l1[j++]); //-V595
      }
    }

    if (l2 != nullptr) {
      extraInfo.push_back('\n');
      int32_t j = 0;
      while (l2[j] && l2[j] != '\n' && l2[j] != '\r') { //-V522
        extraInfo.push_back(l2[j++]); //-V595
      }

      extraInfo.push_back('\n');
      j = 0;

      drawUnderliner(pos, width, extraInfo);
    }

    if (!isBlankLine(l3)) {
      extraInfo.push_back('\n');
      int32_t j = 0;
      while (l3[j] && l3[j] != '\n' && l3[j] != '\r') { //-V522
        extraInfo.push_back(l3[j++]); //-V595
      }
    }

    const char *extra = nullptr;
    if (l1 || l2 || l3) {
      extraInfo.push_back('\n');
      extraInfo.push_back('\n'); // separate with extra line
      extra = extraInfo.c_str();
    }

    auto messageFunc = _ss(_vm)->_compilererrorhandler;

    const char *msg = message.c_str();

    auto diagMsgFunc = _ss(_vm)->_compilerdiaghandler;
    if (diagMsgFunc) {
      SQCompilerMessage cm;
      cm.intId = desc.id;
      cm.textId = desc.textId;
      cm.line = line;
      cm.column = pos;
      cm.columnsWidth = width;
      cm.message = msg;
      cm.fileName = _sourceName;
      cm.isError = isError;
      diagMsgFunc(_vm, &cm);
    }

    if (_raiseError && messageFunc) {
      SQMessageSeverity sev = SEV_ERROR;
      if (desc.severity == DS_HINT) sev = SEV_HINT;
      else if (desc.severity == DS_WARNING) sev = SEV_WARNING;
      messageFunc(_vm, sev, msg, _sourceName, line, pos, extra);
    }
    if (isError) {
      _vm->_lasterror = SQString::Create(_ss(_vm), msg, message.length());
      doJump = true;
    }
  }
  if (doJump)
    longjmp(_errorjmp, 1);
}